

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int scriptsig_to_witness(uchar *bytes,size_t bytes_len,wally_tx_witness_stack **output)

{
  int iVar1;
  uchar *puVar2;
  size_t bytes_len_00;
  uchar *witness;
  wally_tx_witness_stack *result;
  size_t push_size;
  size_t push_opcode_size;
  wally_tx_witness_stack *local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = (wally_tx_witness_stack *)0x0;
  iVar1 = -2;
  if ((((bytes_len != 0) && (bytes != (uchar *)0x0)) && (output != (wally_tx_witness_stack **)0x0))
     && (iVar1 = wally_tx_witness_stack_init_alloc(2,&local_48), iVar1 == 0)) {
    if (0 < (long)bytes_len) {
      puVar2 = bytes + bytes_len;
      do {
        bytes_len_00 = (long)puVar2 - (long)bytes;
        iVar1 = get_push_size(bytes,bytes_len_00,false,&local_40);
        if ((iVar1 != 0) || (iVar1 = get_push_size(bytes,bytes_len_00,true,&local_38), iVar1 != 0))
        {
LAB_003f48a9:
          wally_tx_witness_stack_free(local_48);
          return iVar1;
        }
        witness = bytes + local_38;
        iVar1 = wally_tx_witness_stack_add(local_48,witness,local_40);
        if (iVar1 != 0) goto LAB_003f48a9;
        bytes = witness + local_40;
      } while (bytes < puVar2);
    }
    *output = local_48;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int scriptsig_to_witness(unsigned char *bytes, size_t bytes_len, struct wally_tx_witness_stack **output)
{
    unsigned char *p = bytes, *end = p + bytes_len;
    struct wally_tx_witness_stack *result = NULL;
    int ret = WALLY_OK;

    if (!bytes || !output || !bytes_len) {
        return WALLY_EINVAL;
    }

    if ((ret = wally_tx_witness_stack_init_alloc(2, &result)) != WALLY_OK) {
        return ret;
    }

    while (p < end) {
        size_t push_size, push_opcode_size;

        if ((ret = script_get_push_size_from_bytes(p, end - p, &push_size)) != WALLY_OK) {
            goto fail;
        }
        if ((ret = script_get_push_opcode_size_from_bytes(p, end - p, &push_opcode_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_opcode_size;

        if ((ret = wally_tx_witness_stack_add(result, p, push_size)) != WALLY_OK) {
            goto fail;
        }
        p += push_size;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_tx_witness_stack_free(result);
    return ret;
}